

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoration_manager.cpp
# Opt level: O3

vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> * __thiscall
spvtools::opt::analysis::DecorationManager::InternalGetDecorationsFor<spvtools::opt::Instruction*>
          (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
           *__return_storage_ptr__,DecorationManager *this,uint32_t id,bool include_linkage)

{
  pointer *pppIVar1;
  iterator iVar2;
  Instruction *this_00;
  undefined8 *puVar3;
  uint32_t uVar4;
  iterator iVar5;
  undefined8 *puVar6;
  uint uVar7;
  undefined8 *puVar8;
  uint32_t group_id;
  Instruction *local_58;
  uint32_t local_4c;
  undefined8 *local_48;
  DecorationManager *local_40;
  uint32_t local_34;
  
  (__return_storage_ptr__->
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40 = this;
  local_34 = id;
  iVar5 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)this,&local_34);
  if (iVar5.
      super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
      ._M_cur != (__node_type *)0x0) {
    puVar8 = *(undefined8 **)
              ((long)iVar5.
                     super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                     ._M_cur + 0x18);
    for (puVar6 = *(undefined8 **)
                   ((long)iVar5.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                          ._M_cur + 0x10); puVar6 != puVar8; puVar6 = puVar6 + 1) {
      local_58 = (Instruction *)*puVar6;
      if (local_58->opcode_ == OpDecorate) {
        uVar7 = (local_58->has_result_id_ & 1) + 1;
        if (local_58->has_type_id_ == false) {
          uVar7 = (uint)local_58->has_result_id_;
        }
        uVar4 = Instruction::GetSingleWordOperand(local_58,uVar7 + 1);
        if (uVar4 != 0x29 || include_linkage) goto LAB_00590956;
      }
      else {
LAB_00590956:
        iVar2._M_current =
             (__return_storage_ptr__->
             super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
          _M_realloc_insert<spvtools::opt::Instruction*const&>
                    ((vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                      *)__return_storage_ptr__,iVar2,&local_58);
        }
        else {
          *iVar2._M_current = local_58;
          pppIVar1 = &(__return_storage_ptr__->
                      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          *pppIVar1 = *pppIVar1 + 1;
        }
      }
    }
    puVar6 = *(undefined8 **)
              ((long)iVar5.
                     super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                     ._M_cur + 0x28);
    local_48 = *(undefined8 **)
                ((long)iVar5.
                       super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                       ._M_cur + 0x30);
    if (puVar6 != local_48) {
      do {
        this_00 = (Instruction *)*puVar6;
        uVar4 = (this_00->has_result_id_ & 1) + 1;
        if (this_00->has_type_id_ == false) {
          uVar4 = (uint)this_00->has_result_id_;
        }
        local_4c = Instruction::GetSingleWordOperand(this_00,uVar4);
        iVar5 = std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        *)local_40,&local_4c);
        if (iVar5.
            super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
            ._M_cur == (__node_type *)0x0) {
          __assert_fail("group_iter != id_to_decoration_insts_.end() && \"Unknown group ID\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/decoration_manager.cpp"
                        ,0x1c7,
                        "std::vector<T> spvtools::opt::analysis::DecorationManager::InternalGetDecorationsFor(uint32_t, bool) [T = spvtools::opt::Instruction *]"
                       );
        }
        puVar3 = *(undefined8 **)
                  ((long)iVar5.
                         super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                         ._M_cur + 0x18);
        for (puVar8 = *(undefined8 **)
                       ((long)iVar5.
                              super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                              ._M_cur + 0x10); puVar8 != puVar3; puVar8 = puVar8 + 1) {
          local_58 = (Instruction *)*puVar8;
          if (local_58->opcode_ == OpDecorate) {
            uVar7 = (local_58->has_result_id_ & 1) + 1;
            if (local_58->has_type_id_ == false) {
              uVar7 = (uint)local_58->has_result_id_;
            }
            uVar4 = Instruction::GetSingleWordOperand(local_58,uVar7 + 1);
            if (uVar4 != 0x29 || include_linkage) goto LAB_00590a14;
          }
          else {
LAB_00590a14:
            iVar2._M_current =
                 (__return_storage_ptr__->
                 super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            if (iVar2._M_current ==
                (__return_storage_ptr__->
                super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
              _M_realloc_insert<spvtools::opt::Instruction*const&>
                        ((vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                          *)__return_storage_ptr__,iVar2,&local_58);
            }
            else {
              *iVar2._M_current = local_58;
              pppIVar1 = &(__return_storage_ptr__->
                          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                          )._M_impl.super__Vector_impl_data._M_finish;
              *pppIVar1 = *pppIVar1 + 1;
            }
          }
        }
        puVar6 = puVar6 + 1;
      } while (puVar6 != local_48);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> DecorationManager::InternalGetDecorationsFor(
    uint32_t id, bool include_linkage) {
  std::vector<T> decorations;

  const auto ids_iter = id_to_decoration_insts_.find(id);
  // |id| has no decorations
  if (ids_iter == id_to_decoration_insts_.end()) return decorations;

  const TargetData& target_data = ids_iter->second;

  const auto process_direct_decorations =
      [include_linkage,
       &decorations](const std::vector<Instruction*>& direct_decorations) {
        for (Instruction* inst : direct_decorations) {
          const bool is_linkage =
              inst->opcode() == spv::Op::OpDecorate &&
              spv::Decoration(inst->GetSingleWordInOperand(1u)) ==
                  spv::Decoration::LinkageAttributes;
          if (include_linkage || !is_linkage) decorations.push_back(inst);
        }
      };

  // Process |id|'s decorations.
  process_direct_decorations(ids_iter->second.direct_decorations);

  // Process the decorations of all groups applied to |id|.
  for (const Instruction* inst : target_data.indirect_decorations) {
    const uint32_t group_id = inst->GetSingleWordInOperand(0u);
    const auto group_iter = id_to_decoration_insts_.find(group_id);
    assert(group_iter != id_to_decoration_insts_.end() && "Unknown group ID");
    process_direct_decorations(group_iter->second.direct_decorations);
  }

  return decorations;
}